

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deflate.c
# Opt level: O3

int32_t zng_deflatePending(zng_stream *strm,uint32_t *pending,int32_t *bits)

{
  int iVar1;
  int32_t iVar2;
  
  iVar1 = deflateStateCheck(strm);
  iVar2 = -2;
  if (iVar1 == 0) {
    if (pending != (uint32_t *)0x0) {
      *pending = strm->state->pending;
    }
    iVar2 = 0;
    if (bits != (int32_t *)0x0) {
      *bits = strm->state->bi_valid;
    }
  }
  return iVar2;
}

Assistant:

int32_t Z_EXPORT PREFIX(deflatePending)(PREFIX3(stream) *strm, uint32_t *pending, int32_t *bits) {
    if (deflateStateCheck(strm))
        return Z_STREAM_ERROR;
    if (pending != NULL)
        *pending = strm->state->pending;
    if (bits != NULL)
        *bits = strm->state->bi_valid;
    return Z_OK;
}